

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::SetTests
          (cmCTestMultiProcessHandler *this,TestMap *tests,PropertiesMap *properties)

{
  bool bVar1;
  size_type sVar2;
  reference __k;
  mapped_type_conflict1 *pmVar3;
  pair<const_int,_cmCTestMultiProcessHandler::TestSet> *t;
  iterator __end1;
  iterator __begin1;
  TestMap *__range1;
  PropertiesMap *properties_local;
  TestMap *tests_local;
  cmCTestMultiProcessHandler *this_local;
  
  TestMap::operator=(&this->Tests,tests);
  PropertiesMap::operator=(&this->Properties,properties);
  sVar2 = std::
          map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
          ::size(&(this->Tests).
                  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                );
  this->Total = sVar2;
  __end1 = std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::begin(&(this->Tests).
                    super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                  );
  t = (pair<const_int,_cmCTestMultiProcessHandler::TestSet> *)
      std::
      map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ::end(&(this->Tests).
             super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           );
  while (bVar1 = std::operator!=(&__end1,(_Self *)&t), bVar1) {
    __k = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
          operator*(&__end1);
    pmVar3 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             operator[](&this->TestRunningMap,&__k->first);
    *pmVar3 = false;
    pmVar3 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             operator[](&this->TestFinishMap,&__k->first);
    *pmVar3 = false;
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::operator++
              (&__end1);
  }
  bVar1 = cmCTest::GetShowOnly(this->CTest);
  if (!bVar1) {
    ReadCostData(this);
    bVar1 = CheckCycles(this);
    this->HasCycles = (bool)((bVar1 ^ 0xffU) & 1);
    if ((this->HasCycles & 1U) == 0) {
      CreateTestCostList(this);
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::SetTests(TestMap& tests,
                                          PropertiesMap& properties)
{
  this->Tests = tests;
  this->Properties = properties;
  this->Total = this->Tests.size();
  // set test run map to false for all
  for (auto const& t : this->Tests) {
    this->TestRunningMap[t.first] = false;
    this->TestFinishMap[t.first] = false;
  }
  if (!this->CTest->GetShowOnly()) {
    this->ReadCostData();
    this->HasCycles = !this->CheckCycles();
    if (this->HasCycles) {
      return;
    }
    this->CreateTestCostList();
  }
}